

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O0

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product
          (vloc_synchronized_edges_iterator_t *this)

{
  loc_id_t loc;
  bool bVar1;
  process_id_t i;
  event_id_t event;
  sync_strength_t sVar2;
  reference sync;
  vloc_t *vloc;
  pointer this_00;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  *p_Var3;
  element_type *peVar4;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *this_01;
  uint *puVar5;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  *__lhs;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  *__rhs;
  undefined1 local_50 [8];
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  edges;
  sync_constraint_t *constr;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __end2;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __begin2;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  *__range2;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  constraints;
  vloc_synchronized_edges_iterator_t *this_local;
  
  constraints._end._M_current = (sync_constraint_t *)this;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
  ::clear(&this->_cartesian_it);
  while (bVar1 = at_end(this), ((bVar1 ^ 0xffU) & 1) != 0) {
    sync = __gnu_cxx::
           __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
           ::operator*(&this->_sync_it);
    vloc = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
            ::operator*(&this->_vloc)->super_vloc_t;
    peVar4 = std::
             __shared_ptr_access<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_loc_edges_maps);
    bVar1 = enabled(sync,vloc,peVar4);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
    ::operator++(&this->_sync_it);
  }
  bVar1 = at_end(this);
  if (!bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
              ::operator->(&this->_sync_it);
    ___range2 = tchecker::system::synchronization_t::synchronization_constraints(this_00);
    p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::begin((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                      *)&__range2);
    __end2._M_current = p_Var3->_M_current;
    p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::end((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                    *)&__range2);
    constr = p_Var3->_M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                                       *)&constr), bVar1) {
      edges._end.super_const_iterator._M_current =
           (const_iterator)
           __gnu_cxx::
           __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
           ::operator*(&__end2);
      peVar4 = std::
               __shared_ptr_access<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_loc_edges_maps);
      this_01 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
                intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                ::operator*(&this->_vloc);
      i = tchecker::system::sync_constraint_t::pid
                    ((sync_constraint_t *)edges._end.super_const_iterator._M_current);
      puVar5 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[](this_01,i);
      loc = *puVar5;
      event = tchecker::system::sync_constraint_t::event_id
                        ((sync_constraint_t *)edges._end.super_const_iterator._M_current);
      _local_50 = tchecker::system::loc_edges_maps_t::edges(peVar4,loc,event);
      sVar2 = tchecker::system::sync_constraint_t::strength
                        ((sync_constraint_t *)edges._end.super_const_iterator._M_current);
      if (sVar2 == SYNC_WEAK) {
        __lhs = &range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                 ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                          *)local_50)->super_const_iterator;
        __rhs = &range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                 ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                        *)local_50)->super_const_iterator;
        bVar1 = __gnu_cxx::operator==(__lhs,__rhs);
        if (!bVar1) goto LAB_002faf4d;
      }
      else {
LAB_002faf4d:
        cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
        ::push_back(&this->_cartesian_it,
                    (range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                     *)local_50);
      }
      __gnu_cxx::
      __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product()
{
  _cartesian_it.clear();

  while (!at_end()) {
    if (tchecker::syncprod::enabled(*_sync_it, *_vloc, *_loc_edges_maps))
      break;
    ++_sync_it;
  }

  if (at_end())
    return;

  auto constraints = _sync_it->synchronization_constraints();
  for (auto const & constr : constraints) {
    auto edges = _loc_edges_maps->edges((*_vloc)[constr.pid()], constr.event_id());
    if ((constr.strength() == tchecker::SYNC_WEAK) && (edges.begin() == edges.end()))
      continue;
    _cartesian_it.push_back(edges);
  }
}